

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

ARTKey __thiscall
duckdb::ARTKey::CreateARTKey<duckdb::string_t>
          (ARTKey *this,ArenaAllocator *allocator,string_t value)

{
  idx_t i;
  ulong uVar1;
  data_ptr_t data;
  long lVar2;
  long lVar3;
  byte bVar4;
  idx_t len;
  ulong uVar5;
  undefined8 local_38;
  long local_30;
  ARTKey local_28;
  
  local_30 = value.value._0_8_;
  lVar3 = value.value._0_8_;
  if ((uint)allocator < 0xd) {
    lVar3 = (long)&local_38 + 4;
  }
  uVar5 = (ulong)allocator & 0xffffffff;
  lVar2 = 0;
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    lVar2 = lVar2 + (ulong)(*(byte *)(lVar3 + uVar1) < 2);
  }
  len = uVar5 + lVar2 + 1;
  local_38 = allocator;
  data = ArenaAllocator::Allocate((ArenaAllocator *)this,len);
  lVar2 = 0;
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    bVar4 = *(byte *)(lVar3 + uVar1);
    if (bVar4 < 2) {
      data[lVar2] = '\x01';
      lVar2 = lVar2 + 1;
      bVar4 = *(byte *)(lVar3 + uVar1);
    }
    data[lVar2] = bVar4;
    lVar2 = lVar2 + 1;
  }
  data[lVar2] = '\0';
  ARTKey(&local_28,data,len);
  return local_28;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, string_t value) {
	auto string_data = const_data_ptr_cast(value.GetData());
	auto string_len = value.GetSize();

	// We escape \00 and \01.
	idx_t escape_count = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			escape_count++;
		}
	}

	idx_t key_len = string_len + escape_count + 1;
	auto key_data = allocator.Allocate(key_len);

	// Copy over the data and add escapes.
	idx_t pos = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			// Add escape.
			key_data[pos++] = '\01';
		}
		key_data[pos++] = string_data[i];
	}

	// End with a null-terminator.
	key_data[pos] = '\0';
	return ARTKey(key_data, key_len);
}